

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_fails(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  long lVar3;
  undefined8 extraout_RAX;
  uv_process_options_t *loop;
  uv_process_t *puVar4;
  uv_process_t *puVar5;
  undefined8 in_R9;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 uVar6;
  undefined1 local_18 [16];
  
  puVar5 = (uv_process_t *)local_18;
  init_process_options("",fail_cb);
  loop = &options;
  *options.args = "program-that-had-better-not-exist";
  options.file = "program-that-had-better-not-exist";
  puVar2 = uv_default_loop();
  puVar4 = &process;
  iVar1 = uv_spawn(puVar2,&process,&options);
  if ((iVar1 != -0xd) && (iVar1 != -2)) goto LAB_001baea3;
  iVar1 = uv_is_active((uv_handle_t *)&process);
  local_18._8_8_ = SEXT48(iVar1);
  local_18._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)local_18._8_8_ == (uv_loop_t *)0x0) {
    uv_close((uv_handle_t *)&process,(uv_close_cb)0x0);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_18._8_8_ = SEXT48(iVar1);
    local_18._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_18._8_8_ != (uv_loop_t *)0x0) goto LAB_001bae89;
    loop = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    local_18._8_8_ = (uv_loop_t *)0x0;
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    local_18._0_8_ = SEXT48(iVar1);
    if (local_18._8_8_ == local_18._0_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_fails_cold_1();
LAB_001bae89:
    run_test_spawn_fails_cold_2();
  }
  puVar2 = (uv_loop_t *)(local_18 + 8);
  run_test_spawn_fails_cold_3();
  puVar4 = puVar5;
LAB_001baea3:
  run_test_spawn_fails_cold_4();
  iVar1 = uv_exepath(exepath,&exepath_size);
  lVar3 = (long)iVar1;
  uVar6 = 0;
  if (lVar3 == 0) {
    exepath[exepath_size] = '\0';
    args[0] = exepath;
    args[1] = (char *)puVar2;
    args[2] = (char *)0x0;
    args[3] = (char *)0x0;
    args[4] = (char *)0x0;
    options.file = exepath;
    options.args = args;
    options.exit_cb = (uv_exit_cb)puVar4;
    options.flags = 0;
    return 0x397110;
  }
  init_process_options_cold_1();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,0x56,"0 && \"fail_cb called\"",in_R9,extraout_RAX,uVar6,lVar3,loop);
  abort();
}

Assistant:

TEST_IMPL(spawn_fails) {
  int r;

  init_process_options("", fail_cb);
  options.file = options.args[0] = "program-that-had-better-not-exist";

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == UV_ENOENT || r == UV_EACCES);
  ASSERT_OK(uv_is_active((uv_handle_t*) &process));
  uv_close((uv_handle_t*) &process, NULL);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}